

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O3

int Cba_NtkIsSeq(Cba_Ntk_t *p)

{
  int iVar1;
  byte bVar2;
  long lVar3;
  Cba_Ntk_t *p_00;
  long lVar4;
  
  bVar2 = p->field_0x14;
  iVar1 = 1;
  if (((bVar2 & 4) == 0) && (iVar1 = 0, (bVar2 & 2) == 0)) {
    iVar1 = (p->vObjType).nSize;
    if (1 < iVar1) {
      lVar4 = 1;
      do {
        lVar3 = (long)iVar1;
        if (lVar3 <= lVar4) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                        ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
        }
        bVar2 = (p->vObjType).pArray[lVar4];
        if (0xffffffa8 < bVar2 - 0x5a) {
          if (bVar2 == 3) {
            if ((p->vObjFunc).nSize < 1) {
LAB_003c37a1:
              p_00 = (Cba_Ntk_t *)0x0;
            }
            else {
              Vec_IntFillExtra(&p->vObjFunc,(int)lVar4 + 1,(uint)bVar2);
              if ((p->vObjFunc).nSize <= lVar4) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                              ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              iVar1 = (p->vObjFunc).pArray[lVar4];
              if (((long)iVar1 < 1) || ((p->pDesign->vNtks).nSize <= iVar1)) goto LAB_003c37a1;
              p_00 = (Cba_Ntk_t *)(p->pDesign->vNtks).pArray[iVar1];
            }
            iVar1 = Cba_NtkIsSeq(p_00);
            if (iVar1 == 0) {
              iVar1 = (p->vObjType).nSize;
              lVar3 = (long)iVar1;
              goto LAB_003c37b2;
            }
          }
          else if (bVar2 - 0x58 < 0xfffffff4) goto LAB_003c37b2;
          bVar2 = p->field_0x14 | 4;
          iVar1 = 1;
          goto LAB_003c37c6;
        }
LAB_003c37b2:
        lVar4 = lVar4 + 1;
      } while (lVar4 < lVar3);
      bVar2 = p->field_0x14;
    }
    bVar2 = bVar2 | 2;
    iVar1 = 0;
LAB_003c37c6:
    p->field_0x14 = bVar2;
  }
  return iVar1;
}

Assistant:

static inline int Cba_NtkIsSeq( Cba_Ntk_t * p )
{
    int iObj;
    if ( p->fSeq )
        return 1;
    if ( p->fComb )
        return 0;
    assert( !p->fSeq && !p->fComb );
    Cba_NtkForEachBox( p, iObj )
        if ( Cba_ObjIsBoxUser(p, iObj) )
        {
            if ( Cba_NtkIsSeq( Cba_ObjNtk(p, iObj) ) )
            {
                p->fSeq = 1;
                return 1;
            }
        }
        else if ( Cba_ObjIsSeq(p, iObj) )
        {
            p->fSeq = 1;
            return 1;
        }
    p->fComb = 1;
    return 0;
}